

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibStop(Sfm_Lib_t *p)

{
  word *__ptr;
  Vec_Mem_t *pVVar1;
  int i;
  long lVar2;
  
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) {
    pVVar1 = (Vec_Mem_t *)0x0;
  }
  else {
    Vec_IntFreeP(&pVVar1->vTable);
    Vec_IntFreeP(&pVVar1->vNexts);
    pVVar1 = p->vTtMem;
  }
  for (lVar2 = 0; lVar2 <= pVVar1->iPage; lVar2 = lVar2 + 1) {
    __ptr = pVVar1->ppPages[lVar2];
    if (__ptr != (word *)0x0) {
      free(__ptr);
      pVVar1->ppPages[lVar2] = (word *)0x0;
    }
  }
  free(pVVar1->ppPages);
  free(pVVar1);
  Vec_IntErase(&p->vLists);
  Vec_IntErase(&p->vCounts);
  Vec_IntErase(&p->vHits);
  Vec_IntErase(&p->vProfs);
  Vec_IntErase(&p->vStore);
  Vec_IntErase(&p->vTemp);
  if (p->pCells != (Mio_Cell2_t *)0x0) {
    free(p->pCells);
    p->pCells = (Mio_Cell2_t *)0x0;
  }
  free(p->pObjs);
  free(p);
  return;
}

Assistant:

void Sfm_LibStop( Sfm_Lib_t * p )
{
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    Vec_IntErase( &p->vLists );
    Vec_IntErase( &p->vCounts );
    Vec_IntErase( &p->vHits );
    Vec_IntErase( &p->vProfs );
    Vec_IntErase( &p->vStore );
    Vec_IntErase( &p->vTemp );
    ABC_FREE( p->pCells );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}